

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

void __thiscall
kj::_::
Tuple<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
::
Tuple<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
          (Tuple<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
           *this,Maybe<kj::Array<kj::String>_> *params,
          Array<capnp::Orphan<capnp::compiler::Statement>_> *params_1,
          Maybe<kj::Array<kj::String>_> *params_2)

{
  Maybe<kj::Array<kj::String>_> *params_00;
  Array<capnp::Orphan<capnp::compiler::Statement>_> *params_1_00;
  Maybe<kj::Array<kj::String>_> *params_2_00;
  Maybe<kj::Array<kj::String>_> *params_local_2;
  Array<capnp::Orphan<capnp::compiler::Statement>_> *params_local_1;
  Maybe<kj::Array<kj::String>_> *params_local;
  Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>
  *this_local;
  
  params_00 = fwd<kj::Maybe<kj::Array<kj::String>>>(params);
  params_1_00 = fwd<kj::Array<capnp::Orphan<capnp::compiler::Statement>>>(params_1);
  params_2_00 = fwd<kj::Maybe<kj::Array<kj::String>>>(params_2);
  TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
  ::
  TupleImpl<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
            ((TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
              *)this,params_00,params_1_00,params_2_00);
  return;
}

Assistant:

constexpr Tuple(Params&&... params): impl(kj::fwd<Params>(params)...) {}